

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswread.c
# Opt level: O2

ssw_file_t ssw_open_file(char *filename)

{
  uint uVar1;
  ulong uVar2;
  long *plVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  ssw_file_t ff;
  char *pcVar8;
  FILE *pFVar9;
  undefined8 *unaff_R12;
  long lVar10;
  long lStack_30;
  
  if (filename == (char *)0x0) {
    ssw_error("ssw_open_file called with null string for filename");
  }
  ff = ssw_open_and_procrec0(filename);
  iVar5 = ssw_loadrecord((ssw_fileinternal_t *)ff.internal);
  if (iVar5 == 0) {
    pcVar8 = "ssw_open_file error: problems loading record (A)";
    goto LAB_00103072;
  }
  uVar2 = *(ulong *)((long)ff.internal + 0x170);
  lVar10 = *(long *)((long)ff.internal + 0x100) - ((long)*ff.internal + uVar2);
  plVar3 = *(long **)((long)ff.internal + 0x180);
  iVar5 = *(int *)((long)ff.internal + 0xf4);
  if (uVar2 < 0x20 || iVar5 != 1) {
    if (iVar5 == 3) {
      if (uVar2 == 0x28) goto LAB_00102e5f;
      if (uVar2 != 0x20) goto LAB_00103170;
      if (*plVar3 - 0x80000000U < 0xffffffff00000001) {
        pcVar8 = 
        "ssw_open_file error: MCNP5 files with more than 2147483647 histories are not supported";
        goto LAB_00103072;
      }
      *(int *)((long)ff.internal + 0xdc) = (int)*plVar3;
      *(long *)((long)ff.internal + 0x188) = lVar10;
      if ((plVar3[1] & 0xffffffff80000000U) != 0) {
        pcVar8 = 
        "ssw_open_file error: MCNP5 files with more than 2147483647 particles are not supported";
        goto LAB_00103072;
      }
      *(int *)((long)ff.internal + 0xe0) = (int)plVar3[1];
      *(long *)((long)ff.internal + 400) = lVar10 + 8;
      iVar5 = (int)plVar3[2];
      goto LAB_00102d92;
    }
    if (iVar5 == 2) {
      if (uVar2 == 0x28) goto LAB_00102e5f;
      if (uVar2 != 0x14) goto LAB_00103170;
      *(int *)((long)ff.internal + 0xdc) = (int)*plVar3;
      *(long *)((long)ff.internal + 0x188) = lVar10;
      *(undefined4 *)((long)ff.internal + 0xe0) = *(undefined4 *)((long)plVar3 + 4);
      *(long *)((long)ff.internal + 400) = lVar10 + 4;
      iVar5 = (int)plVar3[1];
      lVar10 = 0x10;
      lStack_30 = 0xc;
    }
    else {
      if (uVar2 != 0x28) {
LAB_00103170:
        pcVar8 = "ssw_open_file error: Unexpected record length";
        goto LAB_00103072;
      }
LAB_00102e5f:
      pFVar9 = (FILE *)ssw_impl_stdout_data::thefh;
      if (ssw_impl_stdout_data::thefh == (FILE *)0x0) {
        pFVar9 = _stdout;
      }
      fwrite("ssw_open_file WARNING: File format has header format for which decoding was never tested (feedback appreciated at https://mctools.github.io/mcpl/contact/).\n"
             ,0x9c,1,pFVar9);
      *(int *)((long)ff.internal + 0xdc) = (int)*plVar3;
      *(long *)((long)ff.internal + 0x188) = lVar10;
      *(int *)((long)ff.internal + 0xe0) = (int)plVar3[1];
      *(long *)((long)ff.internal + 400) = lVar10 + 8;
      iVar5 = (int)plVar3[2];
      lVar10 = 0x20;
      lStack_30 = 0x18;
    }
  }
  else {
    *(int *)((long)ff.internal + 0xdc) = (int)*plVar3;
    *(long *)((long)ff.internal + 0x188) = lVar10;
    *(int *)((long)ff.internal + 0xe0) = (int)plVar3[1];
    *(long *)((long)ff.internal + 400) = lVar10 + 8;
    iVar7 = (int)plVar3[2];
    iVar5 = -iVar7;
    if (0 < iVar7) {
      iVar5 = iVar7;
    }
LAB_00102d92:
    lVar10 = 0x18;
    lStack_30 = 0x14;
  }
  *(int *)((long)ff.internal + 0xe8) = iVar5;
  *(undefined4 *)((long)ff.internal + 0xe4) = *(undefined4 *)((long)plVar3 + lStack_30);
  *(undefined4 *)((long)ff.internal + 0xec) = *(undefined4 *)((long)plVar3 + lVar10);
  unaff_R12 = (undefined8 *)&stdout;
  pFVar9 = (FILE *)ssw_impl_stdout_data::thefh;
  if (ssw_impl_stdout_data::thefh == (FILE *)0x0) {
    pFVar9 = _stdout;
  }
  pcVar8 = ssw_mcnpflavour(ff);
  fprintf(pFVar9,"ssw_open_file:    File layout detected : %s\n",pcVar8);
  pFVar9 = (FILE *)ssw_impl_stdout_data::thefh;
  if (ssw_impl_stdout_data::thefh == (FILE *)0x0) {
    pFVar9 = _stdout;
  }
  fprintf(pFVar9,"ssw_open_file:    Code ID fields : \"%s\" / \"%s\"\n",(long)ff.internal + 4,
          (long)ff.internal + 0xd);
  pFVar9 = (FILE *)ssw_impl_stdout_data::thefh;
  if (ssw_impl_stdout_data::thefh == (FILE *)0x0) {
    pFVar9 = _stdout;
  }
  fprintf(pFVar9,"ssw_open_file:    Title field : \"%s\"\n",(long)ff.internal + 0x58);
  pFVar9 = (FILE *)ssw_impl_stdout_data::thefh;
  if (ssw_impl_stdout_data::thefh == (FILE *)0x0) {
    pFVar9 = _stdout;
  }
  uVar1 = *(uint *)((long)ff.internal + 0xdc);
  uVar4 = -uVar1;
  if (0 < (int)uVar1) {
    uVar4 = uVar1;
  }
  fprintf(pFVar9,"ssw_open_file:    Source statistics (histories): %11i\n",(ulong)uVar4);
  pFVar9 = (FILE *)ssw_impl_stdout_data::thefh;
  if (ssw_impl_stdout_data::thefh == (FILE *)0x0) {
    pFVar9 = _stdout;
  }
  fprintf(pFVar9,"ssw_open_file:    Particles in file            : %11i\n",
          (ulong)*(uint *)((long)ff.internal + 0xe0));
  pFVar9 = (FILE *)ssw_impl_stdout_data::thefh;
  if (ssw_impl_stdout_data::thefh == (FILE *)0x0) {
    pFVar9 = _stdout;
  }
  fprintf(pFVar9,"ssw_open_file:    Number of surfaces           : %11i\n",
          (ulong)*(uint *)((long)ff.internal + 0xe4));
  pFVar9 = (FILE *)ssw_impl_stdout_data::thefh;
  if (ssw_impl_stdout_data::thefh == (FILE *)0x0) {
    pFVar9 = _stdout;
  }
  fprintf(pFVar9,"ssw_open_file:    Histories at surfaces        : %11i\n",
          (ulong)*(uint *)((long)ff.internal + 0xec));
  uVar1 = *(uint *)((long)ff.internal + 0xe8);
  if (uVar1 == 6) {
    pcVar8 = "ssw_open_file error: SSW files with spherical sources are not currently supported.";
  }
  else if ((int)uVar1 < 10) {
    pcVar8 = "ssw_open_file error: Too short SSB arrays in file";
  }
  else if (uVar1 < 0xc) {
    if (uVar1 == 10 && *(int *)((long)ff.internal + 0xf4) == 1) {
      pcVar8 = "ssw_open_file error: Unexpected length of SSB arrays in MCNP6 file";
    }
    else {
      iVar5 = *(int *)((long)ff.internal + 0xdc);
      if (iVar5 == 0) {
        pcVar8 = "ssw_open_file error: File has 0 particle histories which should not be possible";
      }
      else {
        iVar7 = 0;
        if (iVar5 < 0) {
          *(int *)((long)ff.internal + 0xdc) = -iVar5;
          iVar5 = ssw_loadrecord((ssw_fileinternal_t *)ff.internal);
          if (iVar5 == 0) {
            pcVar8 = "ssw_open_file error: problems loading record (B)";
            goto LAB_00103072;
          }
          iVar7 = (int)*plVar3;
        }
        iVar5 = -1;
        do {
          iVar5 = iVar5 + 1;
          if (*(int *)((long)ff.internal + 0xe4) + iVar7 < iVar5) goto LAB_0010307a;
          iVar6 = ssw_loadrecord((ssw_fileinternal_t *)ff.internal);
        } while (iVar6 != 0);
        pcVar8 = "ssw_open_file error: problems loading record (C)";
      }
    }
  }
  else {
    pcVar8 = "ssw_open_file error: Unexpected length of SSB arrays in file";
  }
LAB_00103072:
  do {
    ssw_openerror((ssw_fileinternal_t *)ff.internal,pcVar8);
LAB_0010307a:
    *(undefined4 *)((long)ff.internal + 0xf0) = 0;
    *(undefined8 *)((long)ff.internal + 0x198) = *(undefined8 *)((long)ff.internal + 0x100);
    iVar5 = -3;
    while( true ) {
      if (iVar5 == 0) {
        return (ssw_file_t)ff.internal;
      }
      iVar7 = ssw_loadrecord((ssw_fileinternal_t *)ff.internal);
      if (iVar7 == 0) break;
      if ((0 < *(int *)((long)ff.internal + 0xe0)) &&
         (*(ulong *)((long)ff.internal + 0x170) ==
          (ulong)(uint)(*(int *)((long)ff.internal + 0xe8) << 3))) {
        return (ssw_file_t)ff.internal;
      }
      *(long *)((long)ff.internal + 0x198) =
           *(long *)((long)ff.internal + 0x198) +
           *(ulong *)((long)ff.internal + 0x170) + (long)*ff.internal * 2;
      pFVar9 = (FILE *)ssw_impl_stdout_data::thefh;
      if (ssw_impl_stdout_data::thefh == (FILE *)0x0) {
        pFVar9 = (FILE *)*unaff_R12;
      }
      fprintf(pFVar9,
              "ssw_open_file WARNING: Unexpected %llu byte record encountered at end of header. Continuing under the assumption it contains valid configuration data.\n"
             );
      iVar5 = iVar5 + 1;
    }
    if (*(int *)((long)ff.internal + 0xe0) == 0) {
      return (ssw_file_t)ff.internal;
    }
    pcVar8 = "ssw_open_file error: problems loading record (D)";
  } while( true );
}

Assistant:

ssw_file_t ssw_open_file( const char * filename )
{
  if (!filename)
    ssw_error("ssw_open_file called with null string for filename");

  //Open, classify and process first record with mcnp type and version info:

  ssw_file_t out = ssw_open_and_procrec0( filename );
  ssw_fileinternal_t * f = (ssw_fileinternal_t *)out.internal; assert(f);

  //Skip a record:
  if (!ssw_loadrecord(f))
    ssw_openerror(f,"ssw_open_file error: problems loading record (A)");

  //Position of current record payload in file:
  int64_t current_recpos = (int64_t)f->filehandle.current_pos;
  current_recpos -= f->reclen;
  current_recpos -= f->lbuf;

  //Read size data and mark position of nrss & np1 variables.
  int32_t * bi = (int32_t*)f->buf;
  if ( (f->mcnp_type == SSW_MCNP6) && f->lbuf>=32 ) {
    f->np1 = bi[0];
    f->np1pos = current_recpos + 0 * sizeof(int32_t);
    f->nrss = bi[2];
    f->nrsspos = current_recpos + 2 * sizeof(int32_t);
    f->nrcd = abs(bi[4]);
    f->njsw = bi[5];
    f->niss = bi[6];
  } else if ( (f->mcnp_type == SSW_MCNPX) && f->lbuf==20 ) {
    f->np1 = bi[0];
    f->np1pos = current_recpos + 0 * sizeof(int32_t);
    f->nrss = bi[1];
    f->nrsspos = current_recpos + 1 * sizeof(int32_t);
    f->nrcd = bi[2];
    f->njsw = bi[3];
    f->niss = bi[4];
  } else if ( (f->mcnp_type == SSW_MCNP5) && f->lbuf==32 ) {
    int64_t np1_64 = ((int64_t*)f->buf)[0];
    if (np1_64 > 2147483647 || np1_64 < -2147483647)
      ssw_openerror(f,"ssw_open_file error: MCNP5 files with more than 2147483647"
                    " histories are not supported");
    f->np1 = (int32_t)np1_64;
    f->np1pos = current_recpos + 0 * sizeof(int64_t);
    uint64_t nrss_64 = ((uint64_t*)f->buf)[1];
    if (nrss_64 > 2147483647 )
      ssw_openerror(f,"ssw_open_file error: MCNP5 files with more than 2147483647"
                    " particles are not supported");
    f->nrss = (int32_t)nrss_64;
    f->nrsspos = current_recpos + 1 * sizeof(int64_t);
    f->nrcd = bi[4];
    f->njsw = bi[5];
    f->niss = bi[6];
  } else if (f->lbuf==40) {
    fprintf(ssw_stdout(),"ssw_open_file WARNING: File format has header format for which decoding was never tested (feedback"
            " appreciated at https://mctools.github.io/mcpl/contact/).\n");
    f->np1 = bi[0];
    f->np1pos = current_recpos + 0 * sizeof(int32_t);
    f->nrss = bi[2];
    f->nrsspos = current_recpos + 2 * sizeof(int32_t);
    f->nrcd = bi[4];
    f->njsw = bi[6];
    f->niss = bi[8];
  } else {
    ssw_openerror(f,"ssw_open_file error: Unexpected record length");
  }

  fprintf(ssw_stdout(),"ssw_open_file:    File layout detected : %s\n",ssw_mcnpflavour(out));
  fprintf(ssw_stdout(),"ssw_open_file:    Code ID fields : \"%s\" / \"%s\"\n",f->kods,f->vers);
  fprintf(ssw_stdout(),"ssw_open_file:    Title field : \"%s\"\n",f->aids);
  /* fprintf(ssw_stdout(),"ssw_open_file: Found kods  = '%s'\n",f->kods); */
  /* fprintf(ssw_stdout(),"ssw_open_file: Found vers  = '%s'\n",f->vers); */
  /* fprintf(ssw_stdout(),"ssw_open_file: Found lods  = '%s'\n",f->lods); */
  /* fprintf(ssw_stdout(),"ssw_open_file: Found idtms = '%s'\n",f->idtms); */
  /* fprintf(ssw_stdout(),"ssw_open_file: Found probs = '%s'\n",f->probs); */
  /* fprintf(ssw_stdout(),"ssw_open_file: Found aids  = '%s'\n",f->aids); */
  fprintf(ssw_stdout(),"ssw_open_file:    Source statistics (histories): %11i\n" , abs(f->np1));
  fprintf(ssw_stdout(),"ssw_open_file:    Particles in file            : %11i\n" , f->nrss);
  fprintf(ssw_stdout(),"ssw_open_file:    Number of surfaces           : %11i\n" , f->njsw);
  fprintf(ssw_stdout(),"ssw_open_file:    Histories at surfaces        : %11i\n" , f->niss);
  //  fprintf(ssw_stdout(),"ssw_open_file: File length of SSB array          : %11i\n" , f->nrcd);

  if(f->nrcd==6)
    ssw_openerror(f,"ssw_open_file error: SSW files with spherical sources are not currently supported.");
  if(f->nrcd<10)
    ssw_openerror(f,"ssw_open_file error: Too short SSB arrays in file");
  if(f->nrcd>11)
    ssw_openerror(f,"ssw_open_file error: Unexpected length of SSB arrays in file");

  if ( (f->mcnp_type == SSW_MCNP6) && f->nrcd==10 )
    ssw_openerror(f,"ssw_open_file error: Unexpected length of SSB arrays in MCNP6 file");

  int32_t niwr = 0;
  if (f->np1==0)
    ssw_openerror(f,"ssw_open_file error: File has 0 particle histories which should not be possible");

  if (f->np1<0) {//Sign is well-defined since f->np1!=0
    f->np1 = - f->np1;
    if (!ssw_loadrecord(f))
      ssw_openerror(f,"ssw_open_file error: problems loading record (B)");
    niwr = bi[0];
    //mipts = bi[1];//source particle type
    //kjaq  = bi[2];//macrobody facet flag
  }

  //skip over njsw + niwr + 1 records which we are not interested in:
  int i;
  for (i = 0; i < f->njsw+niwr+1; ++i) {
    if (!ssw_loadrecord(f))
      ssw_openerror(f,"ssw_open_file error: problems loading record (C)");
  }

  //End of header? Mark the position:
  f->pos = 0;
  f->headlen = (size_t)f->filehandle.current_pos;

  //Check that it was really the end of the header by preloading the next
  //record(s) and checking if the length corresponds to that of particle data
  //(NB: ssw_load_particle knows that the particle at position 0 will have
  //already been loaded by these checks). See also
  //https://github.com/mctools/mcpl/issues/45:
  unsigned nmaxunexpected = 3;
  while ( nmaxunexpected-- > 0 ) {
    if (!ssw_loadrecord(f)) {
      //For files with 0 particles, we assume (this is not guaranteed of
      //course!) that the failure is due to EOF:
      if (f->nrss==0)
        break;
      //But this is certainly an error for files with >0 particles:
      ssw_openerror(f,"ssw_open_file error: problems loading record (D)");
    }
    if ( f->nrss > 0 && f->lbuf == (unsigned)8*f->nrcd ) {
      //Looks like we preloaded the first particle of the file!
      break;
    } else {
      //Looks like this could not be a particle, so we interpret this as if the
      //header was actually one record longer than previously thought:
      f->headlen += f->reclen * 2 + f->lbuf;
      fprintf( ssw_stdout(),
               "ssw_open_file WARNING: Unexpected %llu byte record encountered"
               " at end of header. Continuing under the assumption it"
               " contains valid configuration data.\n",
               (unsigned long long)f->lbuf );
    }
  }

  //Return handle:
  out.internal = f;
  return out;
}